

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  pointer pcVar1;
  size_type sVar2;
  Node *this_00;
  size_type sVar3;
  char *pcVar4;
  bool bVar5;
  int32_t iVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  Descriptor *this_01;
  reference ppVar10;
  FieldDescriptor *this_02;
  Node *node_00;
  MergeOptions *options_00;
  LogMessage *pLVar11;
  Message *pMVar12;
  Message *pMVar13;
  uint64_t uVar14;
  EnumValueDescriptor *pEVar15;
  int64_t iVar16;
  Reflection *this_03;
  Reflection *this_04;
  int iVar17;
  uint index;
  float fVar18;
  double dVar19;
  Metadata MVar20;
  const_iterator cVar21;
  const_iterator cVar22;
  string_view name;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  LogMessage local_a0;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
  local_90;
  const_iterator local_80;
  string local_70;
  string local_50;
  
  if ((this->root_).children.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .tree_.size_ == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
               ,0x1ae,"!node->children.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_90);
  }
  MVar20 = Message::GetMetadata((Message *)node);
  this_03 = MVar20.reflection;
  MVar20 = Message::GetMetadata((Message *)options);
  this_04 = MVar20.reflection;
  MVar20 = Message::GetMetadata((Message *)node);
  this_01 = MVar20.descriptor;
  cVar21 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                    *)this);
  local_90.node_ = cVar21.node_;
  local_90.position_ = cVar21.position_;
  cVar22 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                  *)this);
  local_80.node_ = cVar22.node_;
  local_80.position_ = cVar22.position_;
  do {
    bVar5 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
            ::operator!=(&local_90,&local_80);
    if (!bVar5) {
      return;
    }
    ppVar10 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
              ::operator*(&local_90);
    pcVar1 = (ppVar10->first)._M_dataplus._M_p;
    sVar2 = (ppVar10->first)._M_string_length;
    this_00 = (ppVar10->second)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
              .
              super__Head_base<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_false>
              ._M_head_impl;
    name._M_str = pcVar1;
    name._M_len = sVar2;
    this_02 = Descriptor::FindFieldByName(this_01,name);
    if (this_02 == (FieldDescriptor *)0x0) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                 ,0x1b7);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&local_a0,(char (*) [20])"Cannot find field \"");
      v_01._M_str = pcVar1;
      v_01._M_len = sVar2;
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v_01);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar11,(char (*) [14])"\" in message ");
      pcVar4 = (this_01->all_names_).payload_;
      v_02._M_len = (ulong)*(ushort *)(pcVar4 + 2);
      v_02._M_str = pcVar4 + ~v_02._M_len;
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v_02);
LAB_00cc9ed2:
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_a0);
    }
    else {
      sVar3 = *(size_type *)((long)&((Node *)&this_00->children)->children + 0x10);
      bVar5 = FieldDescriptor::is_repeated(this_02);
      if (sVar3 == 0) {
        if (bVar5) {
          if (*(char *)((long)&(source->super_MessageLite)._vptr_MessageLite + 1) == '\x01') {
            Reflection::ClearField(this_04,(Message *)options,this_02);
          }
          switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4)) {
          case 1:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              iVar6 = Reflection::GetRepeatedInt32(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddInt32(this_04,(Message *)options,this_02,iVar6);
            }
            break;
          case 2:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              iVar16 = Reflection::GetRepeatedInt64(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddInt64(this_04,(Message *)options,this_02,iVar16);
            }
            break;
          case 3:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              uVar8 = Reflection::GetRepeatedUInt32(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddUInt32(this_04,(Message *)options,this_02,uVar8);
            }
            break;
          case 4:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              uVar14 = Reflection::GetRepeatedUInt64(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddUInt64(this_04,(Message *)options,this_02,uVar14);
            }
            break;
          case 5:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              dVar19 = Reflection::GetRepeatedDouble(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddDouble(this_04,(Message *)options,this_02,dVar19);
            }
            break;
          case 6:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              fVar18 = Reflection::GetRepeatedFloat(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddFloat(this_04,(Message *)options,this_02,fVar18);
            }
            break;
          case 7:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              bVar5 = Reflection::GetRepeatedBool(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddBool(this_04,(Message *)options,this_02,bVar5);
            }
            break;
          case 8:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              pEVar15 = Reflection::GetRepeatedEnum(this_03,(Message *)node,this_02,iVar17);
              Reflection::AddEnum(this_04,(Message *)options,this_02,pEVar15);
            }
            break;
          case 9:
            uVar9 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            index = 0;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (; uVar9 != index; index = index + 1) {
              destination = (Message *)(ulong)index;
              Reflection::GetRepeatedString_abi_cxx11_
                        (&local_70,this_03,(Message *)node,this_02,index);
              Reflection::AddString(this_04,(Message *)options,this_02,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
            }
            break;
          case 10:
            iVar7 = Reflection::FieldSize(this_03,(Message *)node,this_02);
            iVar17 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar17;
            }
            for (; iVar7 != iVar17; iVar17 = iVar17 + 1) {
              pMVar12 = Reflection::AddMessage
                                  (this_04,(Message *)options,this_02,(MessageFactory *)0x0);
              pMVar13 = Reflection::GetRepeatedMessage(this_03,(Message *)node,this_02,iVar17);
              Message::MergeFrom(pMVar12,pMVar13);
            }
          }
        }
        else {
          switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4)) {
          case 1:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (bVar5) {
              iVar6 = Reflection::GetInt32(this_03,(Message *)node,this_02);
              Reflection::SetInt32(this_04,(Message *)options,this_02,iVar6);
            }
            else {
LAB_00cca494:
              Reflection::ClearField(this_04,(Message *)options,this_02);
            }
            break;
          case 2:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            iVar16 = Reflection::GetInt64(this_03,(Message *)node,this_02);
            Reflection::SetInt64(this_04,(Message *)options,this_02,iVar16);
            break;
          case 3:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            uVar8 = Reflection::GetUInt32(this_03,(Message *)node,this_02);
            Reflection::SetUInt32(this_04,(Message *)options,this_02,uVar8);
            break;
          case 4:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            uVar14 = Reflection::GetUInt64(this_03,(Message *)node,this_02);
            Reflection::SetUInt64(this_04,(Message *)options,this_02,uVar14);
            break;
          case 5:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            dVar19 = Reflection::GetDouble(this_03,(Message *)node,this_02);
            Reflection::SetDouble(this_04,(Message *)options,this_02,dVar19);
            break;
          case 6:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            fVar18 = Reflection::GetFloat(this_03,(Message *)node,this_02);
            Reflection::SetFloat(this_04,(Message *)options,this_02,fVar18);
            break;
          case 7:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            bVar5 = Reflection::GetBool(this_03,(Message *)node,this_02);
            Reflection::SetBool(this_04,(Message *)options,this_02,bVar5);
            break;
          case 8:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            pEVar15 = Reflection::GetEnum(this_03,(Message *)node,this_02);
            Reflection::SetEnum(this_04,(Message *)options,this_02,pEVar15);
            break;
          case 9:
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (!bVar5) goto LAB_00cca494;
            Reflection::GetString_abi_cxx11_(&local_50,this_03,(Message *)node,this_02);
            Reflection::SetString(this_04,(Message *)options,this_02,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            break;
          case 10:
            if (*(char *)&(source->super_MessageLite)._vptr_MessageLite == '\x01') {
              Reflection::ClearField(this_04,(Message *)options,this_02);
            }
            bVar5 = Reflection::HasField(this_03,(Message *)node,this_02);
            if (bVar5) {
              pMVar12 = Reflection::MutableMessage
                                  (this_04,(Message *)options,this_02,(MessageFactory *)0x0);
              pMVar13 = Reflection::GetMessage
                                  (this_03,(Message *)node,this_02,(MessageFactory *)0x0);
              Message::MergeFrom(pMVar12,pMVar13);
            }
          }
        }
      }
      else {
        if ((bVar5) ||
           (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4) != 10)) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                     ,0x1bf);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (&local_a0,(char (*) [8])"Field \"");
          v._M_str = pcVar1;
          v._M_len = sVar2;
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar11,(char (*) [14])"\" in message ");
          pcVar4 = (this_01->all_names_).payload_;
          v_00._M_len = (ulong)*(ushort *)(pcVar4 + 2);
          v_00._M_str = pcVar4 + ~v_00._M_len;
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v_00);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar11,(char (*) [45])" is not a singular message field and cannot "
                              );
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (pLVar11,(char (*) [17])"have sub-fields.");
          goto LAB_00cc9ed2;
        }
        node_00 = (Node *)Reflection::GetMessage
                                    (this_03,(Message *)node,this_02,(MessageFactory *)0x0);
        options_00 = (MergeOptions *)
                     Reflection::MutableMessage
                               (this_04,(Message *)options,this_02,(MessageFactory *)0x0);
        MergeMessage((FieldMaskTree *)this_00,node_00,source,options_00,destination);
      }
    }
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  ABSL_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (const auto& kv : node->children) {
    absl::string_view field_name = kv.first;
    const Node* child = kv.second.get();
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      ABSL_LOG(ERROR) << "Cannot find field \"" << field_name
                      << "\" in message " << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        ABSL_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                        << descriptor->full_name()
                        << " is not a singular message field and cannot "
                        << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}